

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_group_ops(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int i;
  uint uVar11;
  pointer ppLVar12;
  Layer *pLVar13;
  long lVar14;
  _func_int *p_Var15;
  ulong uVar16;
  void *pvVar17;
  Allocator *pAVar18;
  int iVar19;
  pointer __arg;
  Allocator *pAVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [32];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar38 [16];
  undefined1 in_ZMM11 [64];
  ParamDict pd;
  int local_2b0;
  uint local_2ac;
  Mat local_2a8;
  int local_25c;
  Mat local_258;
  Allocator *local_210;
  int *piStack_208;
  long local_200;
  uint local_1f8;
  Allocator *local_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  uint local_1d8;
  size_t local_1d0;
  Allocator *local_1c8;
  int *piStack_1c0;
  long local_1b8;
  uint local_1b0;
  Allocator *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  uint local_190;
  size_t local_188;
  void *local_180;
  int *piStack_178;
  long lStack_170;
  undefined4 uStack_168;
  long *local_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined8 local_140;
  void *local_138;
  int *piStack_130;
  long lStack_128;
  undefined4 uStack_120;
  long *local_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_e8;
  size_t local_e0;
  Allocator *local_d8;
  long local_d0;
  ParamDict local_c8;
  Mat local_b8;
  size_t local_68;
  undefined1 *local_60;
  size_t local_58;
  Option *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __arg = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
  p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar19 = *(int *)(&this->field_0xd8 + (long)p_Var15) * *(int *)(&this->field_0xd4 + (long)p_Var15)
  ;
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var15);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var15);
  uVar16 = (long)*(int *)(&this->field_0x104 + (long)p_Var15) / (long)iVar3;
  uVar16 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) / (long)iVar19;
  ppLVar12 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_50 = opt;
  if (0 < (int)((ulong)((long)ppLVar12 - (long)__arg) >> 3)) {
    lVar21 = 0;
    do {
      if (__arg[lVar21] != (Layer *)0x0) {
        (*__arg[lVar21]->_vptr_Layer[1])();
        __arg = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
        ppLVar12 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (int)((ulong)((long)ppLVar12 - (long)__arg) >> 3));
  }
  local_e8 = &this->group_ops;
  if (ppLVar12 != __arg) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = __arg;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_e8,(long)iVar4);
  if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3])) {
    local_60 = &this->field_0x118;
    local_25c = iVar19 * i *
                (((int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_58 = (size_t)local_25c;
    local_68 = (size_t)i;
    p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
    lVar21 = 0;
    local_48 = 0x8000000000000000;
    uStack_40 = 0x8000000000000000;
    do {
      auVar38 = in_ZMM11._0_16_;
      auVar37 = in_ZMM10._0_16_;
      local_258.elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var15);
      local_258.data =
           (void *)(lVar21 * local_58 * local_258.elemsize +
                   *(long *)(&this->field_0x168 + (long)p_Var15));
      local_258.elempack = *(int *)(&this->field_0x180 + (long)p_Var15);
      local_258.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var15);
      local_258.refcount = (int *)0x0;
      local_258.w = (int)local_58;
      local_258.dims = 1;
      local_258.h = 1;
      local_258.d = 1;
      local_258.c = 1;
      local_258.cstep = local_58;
      Mat::clone(&local_b8,(__fn *)&local_258,(void *)0x0,1,__arg);
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            if (local_258.data != (void *)0x0) {
              free(local_258.data);
            }
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
      bVar22 = *(int *)(&this->field_0x100 + (long)p_Var15) == 0;
      if (bVar22) {
        pAVar20 = (Allocator *)0x0;
        local_d0 = 0;
        local_2ac = 0;
        local_d8 = (Allocator *)0x0;
        local_2b0 = 0;
        local_e0 = 0;
      }
      else {
        local_d0 = *(long *)(&this->field_0x1c0 + (long)p_Var15);
        pAVar20 = (Allocator *)
                  (lVar21 * local_68 * local_d0 + *(long *)(&this->field_0x1b0 + (long)p_Var15));
        local_2ac = *(uint *)(&this->field_0x1c8 + (long)p_Var15);
        local_d8 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var15);
        local_e0 = local_68;
        local_2b0 = i;
      }
      bVar22 = !bVar22;
      pLVar13 = create_layer(6);
      ParamDict::ParamDict(&local_c8);
      ParamDict::set(&local_c8,0,i);
      ParamDict::set(&local_c8,1,
                     *(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_c8,0xb,
                     *(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_c8,2,
                     *(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_c8,0xc,
                     *(int *)(&this->field_0xe0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_c8,3,
                     *(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_c8,0xd,
                     *(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ));
      ParamDict::set(&local_c8,4,0);
      ParamDict::set(&local_c8,0xe,0);
      ParamDict::set(&local_c8,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      ParamDict::set(&local_c8,6,local_25c);
      ParamDict::set(&local_c8,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      ParamDict::set(&local_c8,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      ParamDict::set(&local_c8,10,
                     (Mat *)(local_60 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      (*pLVar13->_vptr_Layer[2])(pLVar13,&local_c8);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) == 0) {
        lVar14 = 0x40;
        auVar24._0_12_ = ZEXT812(0);
        auVar24._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_258.data + lVar14) = 0;
          *(undefined1 (*) [16])((long)&local_2a8.elemsize + lVar14) = auVar24;
          *(undefined1 (*) [16])(&local_2a8.field_0x1c + lVar14) = auVar24;
          *(undefined1 (*) [16])((long)&local_2a8.h + lVar14) = auVar24;
          *(undefined1 (*) [16])(&local_2a8.field_0x3c + lVar14) = auVar24;
          lVar14 = lVar14 + 0x48;
        } while (lVar14 != 0x160);
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        if (local_258.refcount != (int *)0x0) {
          LOCK();
          *local_258.refcount = *local_258.refcount + -1;
          UNLOCK();
          if (*local_258.refcount == 0) {
            if (local_258.allocator == (Allocator *)0x0) {
              if (local_258.data != (void *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (*(local_258.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_258.data = local_b8.data;
        local_258.refcount = local_b8.refcount;
        local_258.elemsize = local_b8.elemsize;
        local_258.elempack = local_b8.elempack;
        local_258.allocator = local_b8.allocator;
        local_258.dims = local_b8.dims;
        local_258.w = local_b8.w;
        local_258.h = local_b8.h;
        local_258.d = local_b8.d;
        local_258.c = local_b8.c;
        local_258.cstep = local_b8.cstep;
        p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        if (*(int *)(&this->field_0x10c + (long)p_Var15) != 0) {
          local_2a8.cstep = 0;
          local_2a8.data = (Allocator *)0x0;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0;
          local_2a8.elemsize._0_4_ = 0;
          local_2a8.elempack = 0;
          local_2a8.elemsize._4_4_ = (int)local_2a8.refcount;
          local_2a8.allocator = (Allocator *)local_2a8.data;
          local_2a8.dims = (int)local_2a8.refcount;
          local_2a8.w = local_2a8.elempack;
          local_2a8.h = (int)local_2a8.elemsize;
          local_2a8.d = (int)local_2a8.refcount;
          local_2a8.c = local_2a8.elempack;
          Mat::create(&local_2a8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_00515ca0;
          auVar9 = _DAT_00515c80;
          uVar11 = local_2a8.c * (int)local_2a8.cstep;
          auVar8._8_8_ = uStack_40;
          auVar8._0_8_ = local_48;
          auVar37 = vpcmpeqd_avx(auVar37,auVar37);
          if (0 < (int)uVar11) {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = (ulong)uVar11 - 1;
            auVar24 = vpshufd_avx(auVar26,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) + lVar21 * 4);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar16;
              auVar26 = vpshufd_avx(auVar30,0x44);
              auVar33._16_16_ = auVar26;
              auVar33._0_16_ = auVar26;
              auVar34 = vorps_avx(auVar33,auVar9);
              auVar33 = vorps_avx(auVar10,auVar33);
              auVar26 = vpcmpgtq_avx(auVar8 ^ auVar33._16_16_,auVar8 ^ auVar24);
              auVar30 = vpcmpgtq_avx(auVar8 ^ auVar33._0_16_,auVar8 ^ auVar24);
              auVar26 = vpackssdw_avx(auVar30,auVar26);
              auVar30 = vpcmpgtq_avx(auVar8 ^ auVar34._16_16_,auVar8 ^ auVar24);
              auVar36._0_4_ = (uint)local_48 ^ auVar34._0_4_;
              auVar36._4_4_ = (uint)((ulong)local_48 >> 0x20) ^ auVar34._4_4_;
              auVar36._8_4_ = (uint)uStack_40 ^ auVar34._8_4_;
              auVar36._12_4_ = (uint)((ulong)uStack_40 >> 0x20) ^ auVar34._12_4_;
              auVar36 = vpcmpgtq_avx(auVar36,auVar8 ^ auVar24);
              auVar30 = vpackssdw_avx(auVar36,auVar30);
              auVar26 = vpackssdw_avx(auVar37 ^ auVar30,auVar37 ^ auVar26);
              auVar30 = vpmovsxwd_avx(auVar26);
              auVar26 = vpunpckhwd_avx(auVar26,auVar26);
              auVar34._16_16_ = auVar26;
              auVar34._0_16_ = auVar30;
              auVar34 = vmaskmovps_avx(auVar34,auVar28);
              *(undefined1 (*) [32])((long)(_func_int ***)local_2a8.data + uVar16 * 4) = auVar34;
              uVar16 = uVar16 + 8;
            } while ((uVar11 + 7 & 0xfffffff8) != uVar16);
          }
          piVar7 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          if (piStack_208 != (int *)0x0) {
            LOCK();
            *piStack_208 = *piStack_208 + -1;
            UNLOCK();
            if (*piStack_208 == 0) {
              if (local_1f0 == (Allocator *)0x0) {
                if (local_210 != (Allocator *)0x0) {
                  free(local_210);
                }
              }
              else {
                (*local_1f0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_208 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_210 = (Allocator *)local_2a8.data;
          local_200 = CONCAT44(local_2a8.elemsize._4_4_,(int)local_2a8.elemsize);
          local_1f8 = local_2a8.elempack;
          local_1f0 = local_2a8.allocator;
          local_1e8 = CONCAT44(local_2a8.w,local_2a8.dims);
          uStack_1e0 = CONCAT44(local_2a8.d,local_2a8.h);
          local_1d8 = local_2a8.c;
          local_1d0 = local_2a8.cstep;
          p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          lVar14 = *(long *)(&this->field_0x250 + (long)p_Var15);
          pAVar18 = (Allocator *)(lVar14 * lVar21 + *(long *)(&this->field_0x240 + (long)p_Var15));
          uVar11 = *(uint *)(&this->field_0x258 + (long)p_Var15);
          pAVar20 = *(Allocator **)(&this->field_0x260 + (long)p_Var15);
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (Allocator *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1c0 = (int *)0x0;
          local_1a0 = 0x100000001;
          uStack_198 = 0x100000001;
          local_190 = 1;
          local_188 = 1;
          piVar7 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_1c8 = pAVar18;
          local_1b8 = lVar14;
          local_1b0 = uVar11;
          local_1a8 = pAVar20;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_2a8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2a8.data != (Allocator *)0x0) {
                  free(local_2a8.data);
                }
              }
              else {
                (*(local_2a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        }
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var15)) {
          lVar14 = *(long *)(&this->field_0x298 + (long)p_Var15);
          lVar6 = *(long *)(&this->field_0x288 + (long)p_Var15);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var15);
          plVar5 = *(long **)(&this->field_0x2a8 + (long)p_Var15);
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (long *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (**(code **)(*local_160 + 0x18))();
              }
            }
          }
          piStack_178 = (int *)0x0;
          local_158 = 1;
          uStack_154 = 1;
          uStack_150 = 1;
          uStack_14c = 1;
          local_148 = 1;
          local_140 = 1;
          local_180 = (void *)(lVar14 * lVar21 + lVar6);
          lStack_170 = lVar14;
          uStack_168 = uVar1;
          local_160 = plVar5;
        }
        in_ZMM10 = ZEXT1664(auVar37);
        in_ZMM11 = ZEXT1664(auVar38);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8,&local_258);
        (*pLVar13->_vptr_Layer[3])(pLVar13,&local_2a8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8);
        lVar14 = 0xd8;
        do {
          piVar7 = *(int **)((long)&local_258.refcount + lVar14);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar17 = *(void **)((long)&local_258.data + lVar14);
              plVar5 = *(long **)((long)&local_258.allocator + lVar14);
              if (plVar5 == (long *)0x0) {
                if (pvVar17 != (void *)0x0) {
                  free(pvVar17);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_258.cstep + lVar14) = 0;
          *(undefined8 *)((long)&local_258.refcount + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_258.elemsize + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_258.data + lVar14) = 0;
          *(undefined8 *)((long)&local_258.refcount + lVar14) = 0;
          *(undefined8 *)((long)&local_258.dims + lVar14) = 0;
          *(undefined8 *)((long)&local_258.h + lVar14) = 0;
          *(undefined4 *)((long)&local_258.c + lVar14) = 0;
          lVar14 = lVar14 + -0x48;
        } while (lVar14 != -0x48);
      }
      else {
        lVar14 = 0x40;
        auVar23._0_12_ = ZEXT812(0);
        auVar23._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_258.data + lVar14) = 0;
          *(undefined1 (*) [16])((long)&local_2a8.elemsize + lVar14) = auVar23;
          *(undefined1 (*) [16])(&local_2a8.field_0x1c + lVar14) = auVar23;
          *(undefined1 (*) [16])((long)&local_2a8.h + lVar14) = auVar23;
          *(undefined1 (*) [16])(&local_2a8.field_0x3c + lVar14) = auVar23;
          lVar14 = lVar14 + 0x48;
        } while (lVar14 != 0x1a8);
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        if (local_258.refcount != (int *)0x0) {
          LOCK();
          *local_258.refcount = *local_258.refcount + -1;
          UNLOCK();
          if (*local_258.refcount == 0) {
            if (local_258.allocator == (Allocator *)0x0) {
              if (local_258.data != (void *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (*(local_258.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_258.data = local_b8.data;
        local_258.refcount = local_b8.refcount;
        local_258.elemsize = local_b8.elemsize;
        local_258.elempack = local_b8.elempack;
        local_258.allocator = local_b8.allocator;
        local_258.dims = local_b8.dims;
        local_258.w = local_b8.w;
        local_258.h = local_b8.h;
        local_258.d = local_b8.d;
        local_258.c = local_b8.c;
        local_258.cstep = local_b8.cstep;
        if (piStack_208 != (int *)0x0) {
          LOCK();
          *piStack_208 = *piStack_208 + -1;
          UNLOCK();
          if (*piStack_208 == 0) {
            if (local_1f0 == (Allocator *)0x0) {
              if (local_210 != (Allocator *)0x0) {
                free(local_210);
              }
            }
            else {
              (*local_1f0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_208 = (int *)0x0;
        local_200 = local_d0;
        local_1f8 = local_2ac;
        local_1f0 = local_d8;
        local_1d8 = (uint)bVar22;
        local_1e8 = CONCAT44(local_2b0,local_1d8);
        uStack_1e0 = (ulong)CONCAT14(bVar22,local_1d8);
        local_1d0 = local_e0;
        p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        local_210 = pAVar20;
        if (*(int *)(&this->field_0x10c + (long)p_Var15) != 0) {
          local_2a8.cstep = 0;
          local_2a8.data = (Allocator *)0x0;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0;
          local_2a8.elemsize._0_4_ = 0;
          local_2a8.elemsize._4_4_ = 0;
          local_2a8.elempack = 0;
          local_2a8.h = 0;
          local_2a8.d = 0;
          local_2a8.c = 0;
          local_2a8.allocator = (Allocator *)0x0;
          local_2a8.dims = 0;
          local_2a8.w = 0;
          Mat::create(&local_2a8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_00515ca0;
          auVar9 = _DAT_00515c80;
          uVar11 = local_2a8.c * (int)local_2a8.cstep;
          auVar37._8_8_ = uStack_40;
          auVar37._0_8_ = local_48;
          auVar38 = vpcmpeqd_avx(auVar38,auVar38);
          if (0 < (int)uVar11) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = (ulong)uVar11 - 1;
            auVar24 = vpshufd_avx(auVar25,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) + lVar21 * 4);
            auVar27._4_4_ = uVar1;
            auVar27._0_4_ = uVar1;
            auVar27._8_4_ = uVar1;
            auVar27._12_4_ = uVar1;
            auVar27._16_4_ = uVar1;
            auVar27._20_4_ = uVar1;
            auVar27._24_4_ = uVar1;
            auVar27._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar16;
              auVar8 = vpshufd_avx(auVar29,0x44);
              auVar31._16_16_ = auVar8;
              auVar31._0_16_ = auVar8;
              auVar28 = vorps_avx(auVar9,auVar31);
              auVar34 = vorps_avx(auVar10,auVar31);
              auVar8 = vpcmpgtq_avx(auVar37 ^ auVar34._16_16_,auVar37 ^ auVar24);
              auVar26 = vpcmpgtq_avx(auVar37 ^ auVar34._0_16_,auVar37 ^ auVar24);
              auVar8 = vpackssdw_avx(auVar26,auVar8);
              auVar26 = vpcmpgtq_avx(auVar37 ^ auVar28._16_16_,auVar37 ^ auVar24);
              auVar35._0_4_ = (uint)local_48 ^ auVar28._0_4_;
              auVar35._4_4_ = (uint)((ulong)local_48 >> 0x20) ^ auVar28._4_4_;
              auVar35._8_4_ = (uint)uStack_40 ^ auVar28._8_4_;
              auVar35._12_4_ = (uint)((ulong)uStack_40 >> 0x20) ^ auVar28._12_4_;
              auVar30 = vpcmpgtq_avx(auVar35,auVar37 ^ auVar24);
              auVar26 = vpackssdw_avx(auVar30,auVar26);
              auVar8 = vpackssdw_avx(auVar38 ^ auVar26,auVar38 ^ auVar8);
              auVar26 = vpmovsxwd_avx(auVar8);
              auVar8 = vpunpckhwd_avx(auVar8,auVar8);
              auVar32._16_16_ = auVar8;
              auVar32._0_16_ = auVar26;
              auVar28 = vmaskmovps_avx(auVar32,auVar27);
              *(undefined1 (*) [32])((long)(_func_int ***)local_2a8.data + uVar16 * 4) = auVar28;
              uVar16 = uVar16 + 8;
            } while ((uVar11 + 7 & 0xfffffff8) != uVar16);
          }
          piVar7 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (Allocator *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1c0 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_1c8 = (Allocator *)local_2a8.data;
          local_1b8 = CONCAT44(local_2a8.elemsize._4_4_,(int)local_2a8.elemsize);
          local_1b0 = local_2a8.elempack;
          local_1a8 = local_2a8.allocator;
          local_1a0 = CONCAT44(local_2a8.w,local_2a8.dims);
          uStack_198 = CONCAT44(local_2a8.d,local_2a8.h);
          local_190 = local_2a8.c;
          local_188 = local_2a8.cstep;
          p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          lVar14 = *(long *)(&this->field_0x250 + (long)p_Var15);
          pvVar17 = (void *)(lVar14 * lVar21 + *(long *)(&this->field_0x240 + (long)p_Var15));
          uVar1 = *(undefined4 *)(&this->field_0x258 + (long)p_Var15);
          plVar5 = *(long **)(&this->field_0x260 + (long)p_Var15);
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (long *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (**(code **)(*local_160 + 0x18))();
              }
            }
          }
          piStack_178 = (int *)0x0;
          local_158 = 1;
          uStack_154 = 1;
          uStack_150 = 1;
          uStack_14c = 1;
          local_148 = 1;
          local_140 = 1;
          piVar7 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_180 = pvVar17;
          lStack_170 = lVar14;
          uStack_168 = uVar1;
          local_160 = plVar5;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_2a8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2a8.data != (Allocator *)0x0) {
                  free(local_2a8.data);
                }
              }
              else {
                (*(local_2a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        }
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var15)) {
          lVar14 = *(long *)(&this->field_0x298 + (long)p_Var15);
          lVar6 = *(long *)(&this->field_0x288 + (long)p_Var15);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var15);
          plVar5 = *(long **)(&this->field_0x2a8 + (long)p_Var15);
          if (piStack_130 != (int *)0x0) {
            LOCK();
            *piStack_130 = *piStack_130 + -1;
            UNLOCK();
            if (*piStack_130 == 0) {
              if (local_118 == (long *)0x0) {
                if (local_138 != (void *)0x0) {
                  free(local_138);
                }
              }
              else {
                (**(code **)(*local_118 + 0x18))();
              }
            }
          }
          piStack_130 = (int *)0x0;
          local_110 = 1;
          uStack_10c = 1;
          uStack_108 = 1;
          uStack_104 = 1;
          local_100 = 1;
          local_f8 = 1;
          local_138 = (void *)(lVar14 * lVar21 + lVar6);
          lStack_128 = lVar14;
          uStack_120 = uVar1;
          local_118 = plVar5;
        }
        in_ZMM10 = ZEXT1664(auVar37);
        in_ZMM11 = ZEXT1664(auVar38);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8,&local_258);
        (*pLVar13->_vptr_Layer[3])(pLVar13,&local_2a8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8);
        lVar14 = 0x120;
        do {
          piVar7 = *(int **)((long)&local_258.refcount + lVar14);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar17 = *(void **)((long)&local_258.data + lVar14);
              plVar5 = *(long **)((long)&local_258.allocator + lVar14);
              if (plVar5 == (long *)0x0) {
                if (pvVar17 != (void *)0x0) {
                  free(pvVar17);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_258.cstep + lVar14) = 0;
          *(undefined8 *)((long)&local_258.refcount + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_258.elemsize + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_258.data + lVar14) = 0;
          *(undefined8 *)((long)&local_258.refcount + lVar14) = 0;
          *(undefined8 *)((long)&local_258.dims + lVar14) = 0;
          *(undefined8 *)((long)&local_258.h + lVar14) = 0;
          *(undefined4 *)((long)&local_258.c + lVar14) = 0;
          lVar14 = lVar14 + -0x48;
        } while (lVar14 != -0x48);
      }
      (*pLVar13->_vptr_Layer[4])(pLVar13,local_50);
      (local_e8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar21] = pLVar13;
      ParamDict::~ParamDict(&local_c8);
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar21 = lVar21 + 1;
      p_Var15 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
    } while (lVar21 < *(int *)(&this->field_0x108 + (long)p_Var15));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}